

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction.h
# Opt level: O3

void __thiscall sqlib::transaction_lock::~transaction_lock(transaction_lock *this)

{
  database *this_00;
  string local_38;
  
  if ((this->m_active == true) && (this->m_commit_fail == false)) {
    this_00 = this->m_db;
    local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"ROLLBACK","");
    database::execute_sql(this_00,&local_38);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

~transaction_lock() {
    // TODO: reexamine the m_commit_fail logic
    if(m_active && m_commit_fail == false) {
      try {
        m_db.execute_sql("ROLLBACK");
      } catch(const sql_error&) {
        // Don't let this exception fall through.
      }
    }
  }